

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::BlobProto::Clear(BlobProto *this)

{
  bool bVar1;
  LogMessage *other;
  LogFinisher local_8d [20];
  byte local_79;
  LogMessage local_78;
  BlobProto *local_40;
  BlobProto *this_local;
  InternalMetadataWithArena *local_30;
  InternalMetadataWithArena *local_28;
  undefined4 local_1c;
  HasBits<1UL> *local_18;
  InternalMetadataWithArena *local_10;
  
  local_40 = this;
  google::protobuf::RepeatedField<float>::Clear(&this->data_);
  google::protobuf::RepeatedField<float>::Clear(&this->diff_);
  google::protobuf::RepeatedField<double>::Clear(&this->double_data_);
  google::protobuf::RepeatedField<double>::Clear(&this->double_diff_);
  bVar1 = has_shape(this);
  if (bVar1) {
    local_79 = 0;
    if (this->shape_ == (BlobShape *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                 ,0xd18);
      local_79 = 1;
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_78,"CHECK failed: shape_ != NULL: ");
      google::protobuf::internal::LogFinisher::operator=(local_8d,other);
    }
    if ((local_79 & 1) != 0) {
      google::protobuf::internal::LogMessage::~LogMessage(&local_78);
    }
    BlobShape::Clear(this->shape_);
  }
  local_18 = &this->_has_bits_;
  local_1c = 0;
  if ((local_18->has_bits_[0] & 0x1e) != 0) {
    memset(&this->num_,0,0x10);
  }
  this_local = (BlobProto *)&this->_has_bits_;
  memset(this_local,0,4);
  local_30 = &this->_internal_metadata_;
  if (((uint)(local_30->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_28 = local_30;
    local_10 = local_30;
    google::protobuf::internal::InternalMetadataWithArena::DoClear(local_30);
  }
  return;
}

Assistant:

void BlobProto::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.BlobProto)
  data_.Clear();
  diff_.Clear();
  double_data_.Clear();
  double_diff_.Clear();
  if (has_shape()) {
    GOOGLE_DCHECK(shape_ != NULL);
    shape_->::caffe::BlobShape::Clear();
  }
  if (_has_bits_[0 / 32] & 30u) {
    ::memset(&num_, 0, reinterpret_cast<char*>(&width_) -
      reinterpret_cast<char*>(&num_) + sizeof(width_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}